

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O2

bool Granulator_UploadSample
               (int index,float *data,int numsamples,int numchannels,int samplerate,char *name)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  void *__dest;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  MutexScopeLock mutexScope;
  double integrator [8];
  MutexScopeLock local_90;
  float *local_88;
  char *local_80;
  double local_78 [9];
  
  if ((uint)index < 0x10) {
    local_90.mutex = (Mutex *)Granulator::sampleMutex;
    local_80 = name;
    Mutex::Lock((Mutex *)Granulator::sampleMutex);
    if (Granulator::GetGranulatorSample(int)::initialized == '\0') {
      memset(Granulator::GetGranulatorSample(int)::samples,0,0x4280);
      Granulator::GetGranulatorSample(int)::initialized = '\x01';
    }
    lVar3 = (ulong)(uint)index * 0x428;
    puVar1 = (undefined8 *)(Granulator::GetGranulatorSample(int)::samples + lVar3);
    if (*(int *)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 0x20) != 0) {
      if ((void *)*puVar1 != (void *)0x0) {
        operator_delete__((void *)*puVar1);
      }
      if (*(void **)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 8) != (void *)0x0) {
        operator_delete__(*(void **)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 8));
      }
    }
    if (numchannels * numsamples < 1) {
      *(undefined4 *)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 0x20) = 0;
      *puVar1 = 0;
      *(undefined8 *)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 8) = 0;
    }
    else {
      uVar6 = (ulong)(uint)(numchannels * numsamples) << 2;
      local_88 = data;
      __dest = operator_new__(uVar6);
      *puVar1 = __dest;
      pvVar4 = operator_new__(uVar6);
      *(void **)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 8) = pvVar4;
      *(undefined4 *)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 0x20) = 1;
      strcpy(Granulator::GetGranulatorSample(int)::samples + lVar3 + 0x24,local_80);
      memcpy(__dest,local_88,uVar6);
      local_78[6] = 0.0;
      local_78[7] = 0.0;
      local_78[4] = 0.0;
      local_78[5] = 0.0;
      local_78[2] = 0.0;
      local_78[3] = 0.0;
      local_78[0] = 0.0;
      local_78[1] = 0.0;
      iVar2 = 0;
      uVar6 = 0;
      if (0 < numchannels) {
        uVar6 = (ulong)(uint)numchannels;
      }
      iVar5 = 0;
      if (0 < numsamples) {
        iVar5 = numsamples;
      }
      for (; iVar2 != iVar5; iVar2 = iVar2 + 1) {
        lVar7 = 0;
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          dVar9 = local_78[uVar8] * 0.9998999834060669 +
                  (double)ABS(*(float *)((long)__dest + uVar8 * 4));
          local_78[uVar8] = dVar9;
          *(float *)((long)pvVar4 + uVar8 * 4) = (float)dVar9;
          lVar7 = lVar7 + -4;
        }
        __dest = (void *)((long)__dest - lVar7);
        pvVar4 = (void *)((long)pvVar4 - lVar7);
      }
    }
    *(int *)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 0x10) = numsamples;
    *(int *)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 0x14) = numchannels;
    *(int *)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 0x18) = samplerate;
    Granulator::globalupdatecount = Granulator::globalupdatecount + 1;
    *(int *)(Granulator::GetGranulatorSample(int)::samples + lVar3 + 0x1c) =
         Granulator::globalupdatecount;
    MutexScopeLock::~MutexScopeLock(&local_90);
  }
  return (uint)index < 0x10;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API bool Granulator_UploadSample(int index, float* data, int numsamples, int numchannels, int samplerate, const char* name)
{
    if (index < 0 || index >= Granulator::MAXSAMPLE)
        return false;

    MutexScopeLock mutexScope(Granulator::sampleMutex);

    Granulator::GranulatorSample& s = Granulator::GetGranulatorSample(index);
    if (s.allocated)
    {
        delete[] s.data;
        delete[] s.preview;
    }

    int num = numsamples * numchannels;
    if (num > 0)
    {
        s.data = new float[num];
        s.preview = new float[num];
        s.allocated = 1;
        strcpy(s.name, name);
        memcpy(s.data, data, num * sizeof(float));
        double integrator[8]; memset(integrator, 0, sizeof(integrator));
        float* src = s.data;
        float* dst = s.preview;
        for (int n = 0; n < numsamples; n++)
        {
            for (int i = 0; i < numchannels; i++)
            {
                // Calculate full integrated signal for better reconstruction in GetFloatBufferCallback.
                // The small leak of 0.1% prevents build-up of DC.
                integrator[i] = integrator[i] * 0.9999f + fabsf(*src++);
                *dst++ = integrator[i];
            }
        }
    }
    else
    {
        s.data = NULL;
        s.preview = NULL;
        s.allocated = 0;
    }

    s.numsamples = numsamples;
    s.numchannels = numchannels;
    s.samplerate = samplerate;
    s.updatecount = ++Granulator::globalupdatecount;

    return true;
}